

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105118) = 0;
  *(undefined8 *)(*(long *)(std::cout + -0x18) + 0x1050f8) = 0;
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(nullptr),cout.tie(nullptr);
    //用C语句来分配LNode型空间申请结点示例
    LNode *ExampleLNode = (LNode*)malloc(sizeof(LNode));
    //do something...
    return 0;
}